

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::MemoryImport::~MemoryImport(MemoryImport *this)

{
  ~MemoryImport(this);
  operator_delete(this);
  return;
}

Assistant:

explicit MemoryImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Memory>(), memory(name) {}